

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O0

FactoredDecPOMDPDiscreteInterface *
ArgumentUtils::GetFactoredDecPOMDPDiscreteInterfaceFromArgs(Arguments *args)

{
  FactoredDecPOMDPDiscrete *this;
  undefined8 uVar1;
  ostream *poVar2;
  long *plVar3;
  int *in_RDI;
  MADPParser parser;
  FactoredDecPOMDPDiscrete *decpomdp;
  string dpomdpFile;
  stringstream ss;
  FactoredDecPOMDPDiscreteInterface *dp;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffffd18;
  E *in_stack_fffffffffffffd20;
  FactoredDecPOMDPDiscreteInterface *local_2c0;
  allocator<char> *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd68;
  ProblemFireFightingGraph *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  MADPParser local_262;
  undefined1 local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [15];
  undefined1 in_stack_fffffffffffffdd7;
  Arguments *in_stack_fffffffffffffdd8;
  size_t in_stack_fffffffffffffde0;
  AlohaVariation in_stack_fffffffffffffde8;
  IslandConfiguration in_stack_fffffffffffffdec;
  ProblemAloha *in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffe0f;
  double in_stack_fffffffffffffe10;
  string local_1e8 [7];
  undefined1 in_stack_fffffffffffffe1f;
  double in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  ProblemFireFightingFactored *in_stack_fffffffffffffe40;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  FactoredDecPOMDPDiscreteInterface *local_10;
  int *local_8;
  
  local_10 = (FactoredDecPOMDPDiscreteInterface *)0x0;
  this = (FactoredDecPOMDPDiscrete *)(ulong)(uint)in_RDI[4];
  local_8 = in_RDI;
  switch(this) {
  case (FactoredDecPOMDPDiscrete *)0x0:
  default:
    directories::MADPGetProblemFilename_abi_cxx11_(in_stack_fffffffffffffdd8);
    plVar3 = (long *)operator_new(0x718);
    local_261 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::string(local_260,local_1e8);
    FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
              (this,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_261 = 0;
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
    MADPParser::MADPParser<FactoredDecPOMDPDiscrete>
              ((MADPParser *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if ((*(byte *)((long)local_8 + 0x222) & 1) == 0) {
      if ((*(byte *)((long)local_8 + 0x65) & 1) != 0) {
        (**(code **)(*plVar3 + 0x300))(plVar3,local_8[0x1a] != 0);
      }
    }
    else {
      FactoredDecPOMDPDiscrete::MarginalizeStateFactor
                (in_stack_fffffffffffffd60,(Index)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
    }
    local_10 = (FactoredDecPOMDPDiscreteInterface *)0x0;
    if (plVar3 != (long *)0x0) {
      local_10 = (FactoredDecPOMDPDiscreteInterface *)((long)plVar3 + *(long *)(*plVar3 + -0x58));
    }
    MADPParser::~MADPParser(&local_262);
    std::__cxx11::string::~string(local_1e8);
    break;
  case (FactoredDecPOMDPDiscrete *)0x1:
  case (FactoredDecPOMDPDiscrete *)0x2:
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = local_188;
    ProblemType::SoftPrint_abi_cxx11_((Problem_t)((ulong)poVar2 >> 0x20));
    poVar2 = std::operator<<(poVar2,local_1b8);
    poVar2 = std::operator<<(poVar2," is not factored.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1b8);
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffd20,(stringstream *)in_stack_fffffffffffffd18);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  case (FactoredDecPOMDPDiscrete *)0x3:
    plVar3 = (long *)operator_new(0x790);
    ProblemFireFightingFactored::ProblemFireFightingFactored
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe1f,
               in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f);
    local_10 = (FactoredDecPOMDPDiscreteInterface *)0x0;
    if (plVar3 != (long *)0x0) {
      local_10 = (FactoredDecPOMDPDiscreteInterface *)((long)plVar3 + *(long *)(*plVar3 + -0x58));
    }
    if ((*(byte *)((long)local_8 + 0x65) & 1) != 0) {
      (**(code **)(*(long *)((long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xf8)) +
                  0x210))((long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xf8),
                          local_8[0x1a] != 0);
    }
    if (0 < *local_8) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ArgumentUtils: Problem instantiated.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case (FactoredDecPOMDPDiscrete *)0x4:
    plVar3 = (long *)operator_new(0x790);
    ProblemFireFightingGraph::ProblemFireFightingGraph
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(size_t)in_stack_fffffffffffffd60
               ,(double)plVar3,SUB81((ulong)in_stack_fffffffffffffd50 >> 0x38,0));
    local_10 = (FactoredDecPOMDPDiscreteInterface *)0x0;
    if (plVar3 != (long *)0x0) {
      local_10 = (FactoredDecPOMDPDiscreteInterface *)((long)plVar3 + *(long *)(*plVar3 + -0x58));
    }
    if ((*(byte *)((long)local_8 + 0x65) & 1) != 0) {
      (**(code **)(*(long *)((long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xf8)) +
                  0x210))((long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xf8),
                          local_8[0x1a] != 0);
    }
    if (0 < *local_8) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ArgumentUtils: Problem instantiated.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    break;
  case (FactoredDecPOMDPDiscrete *)0x6:
    plVar3 = (long *)operator_new(0x748);
    ProblemAloha::ProblemAloha
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
               in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
               (bool)in_stack_fffffffffffffdd7);
    local_2c0 = (FactoredDecPOMDPDiscreteInterface *)0x0;
    if (plVar3 != (long *)0x0) {
      local_2c0 = (FactoredDecPOMDPDiscreteInterface *)((long)plVar3 + *(long *)(*plVar3 + -0x58));
    }
    local_10 = local_2c0;
    if ((*(byte *)((long)local_8 + 0x65) & 1) != 0) {
      (**(code **)(*(long *)((long)&local_2c0->field_0x0 + *(long *)(*(long *)local_2c0 + -0xf8)) +
                  0x210))((long)&local_2c0->field_0x0 + *(long *)(*(long *)local_2c0 + -0xf8),
                          local_8[0x1a] != 0);
    }
  }
  if (0.0 < *(double *)(local_8 + 0x1c)) {
    (**(code **)(*(long *)((long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xb0)) + 0x68
                ))(*(undefined8 *)(local_8 + 0x1c),
                   (long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xb0));
  }
  return local_10;
}

Assistant:

FactoredDecPOMDPDiscreteInterface* GetFactoredDecPOMDPDiscreteInterfaceFromArgs(const Arguments& args)
{
    FactoredDecPOMDPDiscreteInterface * dp = 0;
    switch(args.problem_type) 
    {

        case(ProblemType::DT):
        case(ProblemType::FF):
        {
            stringstream ss;
            ss << SoftPrint(args.problem_type) << " is not factored."<< endl;
            throw(E(ss));
            break;
        }
        case(ProblemType::FFF):
        {
            dp = new ProblemFireFightingFactored(args.nrAgents, args.nrHouses, args.nrFLs);
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem instantiated." << endl;
            break;
        }
        case(ProblemType::FFG):
        {
            dp = new ProblemFireFightingGraph(args.nrAgents, args.nrFLs);
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem instantiated." << endl;
            break;
        }
        case(ProblemType::Aloha):
        {
            dp = new ProblemAloha(
                static_cast<ProblemAloha::IslandConfiguration>(args.islandConf),
                static_cast<ProblemAloha::AlohaVariation>(args.alohaVariation),
                args.maxBacklog,
                args.nrAgents );
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            break;
        }
        case(ProblemType::PARSE):
        default: 
        {   
            string dpomdpFile=directories::MADPGetProblemFilename(args);
            FactoredDecPOMDPDiscrete* decpomdp = 
                new FactoredDecPOMDPDiscrete("", "", dpomdpFile);
            
            MADPParser parser(decpomdp);

            if(args.marginalize)
                decpomdp->MarginalizeStateFactor(args.marginalizationIndex,args.sparse);
            else if(args.cache_flat_models)
                decpomdp->CacheFlatModels(args.sparse);
                
            dp = decpomdp;
            break;
        }
        
    }
    if(args.discount > 0)
        dp->SetDiscount(args.discount);

    return dp;
}